

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::ARM::getDefaultExtensions(ARM *this,StringRef CPU,ArchKind AK)

{
  int iVar1;
  uint *puVar2;
  byte bVar3;
  char *pcVar4;
  char acVar5 [4];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  Optional<unsigned_int> local_38;
  
  pcVar4 = CPU.Data;
  if (pcVar4 == (char *)0x7) {
    iVar1 = bcmp(this,"generic",7);
    if (iVar1 == 0) {
      return *(uint *)(&DAT_002048d4 + (ulong)(uint)CPU.Length * 0x40);
    }
  }
  local_38.Storage.hasVal = false;
  if ((pcVar4 == (char *)0x4) && (*(int *)this == 0x326d7261)) {
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
    local_38.Storage.hasVal = true;
    bVar12 = true;
  }
  else {
    bVar12 = false;
  }
  if ((pcVar4 != (char *)0x4 || bVar12) || (*(int *)this != 0x336d7261)) {
    if ((pcVar4 == (char *)0x4 && !bVar12) && (*(int *)this == 0x366d7261)) {
      puVar2 = (uint *)&DAT_00204994;
      goto LAB_001930da;
    }
  }
  else {
    puVar2 = (uint *)&DAT_00204954;
LAB_001930da:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(*puVar2 | 1);
    local_38.Storage.hasVal = true;
    bVar12 = true;
  }
  if (pcVar4 == (char *)0x5 && !bVar12) {
    iVar1 = bcmp(this,"arm7m",5);
    bVar7 = true;
    bVar6 = true;
    goto LAB_00193185;
  }
  if (pcVar4 == (char *)0x4 && !bVar12) {
    bVar7 = true;
    bVar6 = true;
    bVar8 = true;
    bVar9 = true;
    bVar10 = true;
    if (*(int *)this == 0x386d7261) {
LAB_00193191:
      bVar7 = bVar10;
      bVar9 = true;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar12 = true;
    }
LAB_001931a1:
    if ((!bVar9 && !bVar12) && (iVar1 = bcmp(this,"strongarm1110",0xd), iVar1 == 0))
    goto LAB_001931bf;
  }
  else {
    bVar6 = pcVar4 != (char *)0x6;
    if (!bVar6 && !bVar12) {
      iVar1 = bcmp(this,"arm810",6);
      bVar7 = true;
LAB_00193185:
      bVar8 = true;
LAB_0019318a:
      bVar9 = true;
      bVar10 = bVar7;
      if (iVar1 == 0) goto LAB_00193191;
      goto LAB_001931a1;
    }
    bVar7 = pcVar4 != (char *)0x9;
    if (!bVar7 && !bVar12) {
      iVar1 = bcmp(this,"strongarm",9);
      goto LAB_00193185;
    }
    bVar8 = pcVar4 != (char *)0xc;
    if (!bVar8 && !bVar12) {
      iVar1 = bcmp(this,"strongarm110",0xc);
      goto LAB_0019318a;
    }
    bVar9 = pcVar4 != (char *)0xd;
    if ((bVar9 || bVar12) || (iVar1 = bcmp(this,"strongarm1100",0xd), iVar1 != 0))
    goto LAB_001931a1;
LAB_001931bf:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
    local_38.Storage.hasVal = true;
    bVar12 = true;
  }
  if (pcVar4 != (char *)0x8 || bVar12) {
    bVar10 = pcVar4 != (char *)0xa;
    if (!bVar10 && !bVar12) {
      iVar1 = bcmp(this,"arm7tdmi-s",10);
      bVar11 = true;
      if (iVar1 == 0) goto LAB_00193231;
      goto LAB_00193241;
    }
    bVar11 = pcVar4 != (char *)0x7;
    if ((bVar11 || bVar12) || (iVar1 = bcmp(this,"arm710t",7), iVar1 != 0)) goto LAB_00193241;
LAB_0019327c:
    acVar5[0] = '\x01';
    acVar5[1] = '\0';
    acVar5[2] = '\0';
    acVar5[3] = '\0';
LAB_001939a0:
    local_38.Storage.hasVal = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)acVar5;
  }
  else {
    bVar10 = true;
    bVar11 = true;
    if (*(long *)this == 0x696d6474376d7261) {
LAB_00193231:
      bVar11 = true;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar12 = true;
    }
LAB_00193241:
    if (((!bVar11) && (!bVar12)) && (iVar1 = bcmp(this,"arm720t",7), iVar1 == 0)) goto LAB_0019327c;
    if ((pcVar4 != (char *)0x4) || (bVar12)) {
      if ((pcVar4 != (char *)0x8) || ((bVar12 || (*(long *)this != 0x696d6474396d7261))))
      goto LAB_001932a3;
LAB_00193396:
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_38.Storage.hasVal = true;
      bVar12 = true;
      goto LAB_001933a6;
    }
    if (*(int *)this == 0x396d7261) goto LAB_0019327c;
LAB_001932a3:
    if ((((((!bVar6 && !bVar12) && (iVar1 = bcmp(this,"arm920",6), iVar1 == 0)) ||
          ((!bVar11 && !bVar12 && (iVar1 = bcmp(this,"arm920t",7), iVar1 == 0)))) ||
         ((!bVar11 && !bVar12 && (iVar1 = bcmp(this,"arm922t",7), iVar1 == 0)))) ||
        ((!bVar11 && !bVar12 && (iVar1 = bcmp(this,"arm9312",7), iVar1 == 0)))) ||
       ((((!bVar11 && !bVar12 && (iVar1 = bcmp(this,"arm940t",7), iVar1 == 0)) ||
         ((!bVar6 && !bVar12 && (iVar1 = bcmp(this,"ep9312",6), iVar1 == 0)))) ||
        ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"arm10tdmi",9), iVar1 == 0))))))
    goto LAB_00193396;
    if ((pcVar4 != (char *)0x8) || (bVar12)) {
      if (((pcVar4 != (char *)0x5) || (bVar12)) || (iVar1 = bcmp(this,"arm9e",5), iVar1 != 0))
      goto LAB_001933a6;
LAB_0019399a:
      acVar5[0] = '\x01';
      acVar5[1] = '\x04';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if (*(long *)this == 0x74303230316d7261) goto LAB_00193396;
LAB_001933a6:
    if (((((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"arm946e-s",9), iVar1 == 0)) ||
         ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"arm966e-s",9), iVar1 == 0)))) ||
        ((((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"arm968e-s",9), iVar1 == 0)) ||
          ((!bVar6 && !bVar12 && (iVar1 = bcmp(this,"arm10e",6), iVar1 == 0)))) ||
         ((((((pcVar4 == (char *)0x8 && (!bVar12)) && (*(long *)this == 0x65303230316d7261)) ||
            (((pcVar4 == (char *)0x8 && (!bVar12)) && (*(long *)this == 0x65323230316d7261)))) ||
           ((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"arm926ej-s",10), iVar1 == 0)))) ||
          (((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"arm1136j-s",10), iVar1 == 0)) ||
           (((pcVar4 == (char *)0xb && (!bVar12)) &&
            (iVar1 = bcmp(this,"arm1136jf-s",0xb), iVar1 == 0)))))))))) ||
       ((((pcVar4 == (char *)0xb && (!bVar12)) && (iVar1 = bcmp(this,"arm1136jz-s",0xb), iVar1 == 0)
         ) || ((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"arm1176j-s",10), iVar1 == 0))))))
    goto LAB_0019399a;
    if ((pcVar4 == (char *)0xb) && ((!bVar12 && (iVar1 = bcmp(this,"arm1176jz-s",0xb), iVar1 == 0)))
       ) {
LAB_00193ce5:
      acVar5[0] = '\x01';
      acVar5[1] = '\x05';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if (((!bVar6 && !bVar12) && (iVar1 = bcmp(this,"mpcore",6), iVar1 == 0)) ||
       (((pcVar4 == (char *)0xb && (!bVar12)) && (iVar1 = bcmp(this,"mpcorenovfp",0xb), iVar1 == 0))
       )) goto LAB_0019399a;
    if ((!bVar8 && !bVar12) && (iVar1 = bcmp(this,"arm1176jzf-s",0xc), iVar1 == 0))
    goto LAB_00193ce5;
    if ((((pcVar4 == (char *)0xb) && (!bVar12)) &&
        (iVar1 = bcmp(this,"arm1156t2-s",0xb), iVar1 == 0)) ||
       ((!bVar8 && !bVar12 && (iVar1 = bcmp(this,"arm1156t2f-s",0xc), iVar1 == 0))))
    goto LAB_0019399a;
    if ((((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-m0",9), iVar1 == 0)) ||
        ((!bVar9 && !bVar12 && (iVar1 = bcmp(this,"cortex-m0plus",0xd), iVar1 == 0)))) ||
       (((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"cortex-m1",9), iVar1 == 0)) ||
        ((pcVar4 == (char *)0x5 && ((!bVar12 && (iVar1 = bcmp(this,"sc000",5), iVar1 == 0))))))))
    goto LAB_0019327c;
    if ((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-a5",9), iVar1 == 0)) {
LAB_00193cfb:
      acVar5[0] = '@';
      acVar5[1] = '\x05';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-a7",9), iVar1 == 0)) {
LAB_00193cf0:
      acVar5[0] = 'p';
      acVar5[1] = '\a';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-a8",9), iVar1 == 0)) {
      acVar5[0] = '\0';
      acVar5[1] = '\x05';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-a9",9), iVar1 == 0)) goto LAB_00193cfb;
    if ((((!bVar10 && !bVar12) && (iVar1 = bcmp(this,"cortex-a12",10), iVar1 == 0)) ||
        ((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"cortex-a15",10), iVar1 == 0)))) ||
       ((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"cortex-a17",10), iVar1 == 0))))
    goto LAB_00193cf0;
    if (((pcVar4 == (char *)0x5) && (!bVar12)) && (iVar1 = bcmp(this,"krait",5), iVar1 == 0)) {
      acVar5[0] = '0';
      acVar5[1] = '\x04';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if (((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-r4",9), iVar1 == 0)) ||
       ((!bVar10 && !bVar12 && (iVar1 = bcmp(this,"cortex-r4f",10), iVar1 == 0)))) {
LAB_00193d11:
      acVar5[0] = '\x11';
      acVar5[1] = '\x04';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-r5",9), iVar1 == 0)) ||
        ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"cortex-r7",9), iVar1 == 0)))) ||
       ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"cortex-r8",9), iVar1 == 0)))) {
      acVar5[0] = 'p';
      acVar5[1] = '\x04';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((!bVar10 && !bVar12) && (iVar1 = bcmp(this,"cortex-r52",10), iVar1 == 0)) {
      acVar5[0] = 's';
      acVar5[1] = '\x06';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    acVar5[0] = '\x11';
    acVar5[1] = '\0';
    acVar5[2] = '\0';
    acVar5[3] = '\0';
    if ((((pcVar4 == (char *)0x5) && (!bVar12)) && (iVar1 = bcmp(this,"sc300",5), iVar1 == 0)) ||
       ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"cortex-m3",9), iVar1 == 0)))) goto LAB_001939a0;
    if (((!bVar7 && !bVar12) && (iVar1 = bcmp(this,"cortex-m4",9), iVar1 == 0)) ||
       ((!bVar7 && !bVar12 && (iVar1 = bcmp(this,"cortex-m7",9), iVar1 == 0)))) goto LAB_00193d11;
    if ((!bVar10 && !bVar12) && (iVar1 = bcmp(this,"cortex-m23",10), iVar1 == 0)) goto LAB_001939a0;
    if ((!bVar10 && !bVar12) && (iVar1 = bcmp(this,"cortex-m33",10), iVar1 == 0)) {
      acVar5[0] = '\x10';
      acVar5[1] = '\x04';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
    if ((!bVar10 && !bVar12) && (iVar1 = bcmp(this,"cortex-a32",10), iVar1 == 0)) {
      acVar5[0] = 'r';
      acVar5[1] = '\a';
      acVar5[2] = '\0';
      acVar5[3] = '\0';
      goto LAB_001939a0;
    }
  }
  bVar3 = local_38.Storage.hasVal;
  if (((pcVar4 == (char *)0xa && local_38.Storage.hasVal == false) &&
      (iVar1 = bcmp(this,"cortex-a35",10), iVar1 == 0)) ||
     ((pcVar4 == (char *)0xa && (bool)bVar3 == false &&
      (iVar1 = bcmp(this,"cortex-a53",10), iVar1 == 0)))) {
LAB_00193ae7:
    bVar12 = true;
LAB_00193aea:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = 'r';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\a';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
LAB_00193b19:
    local_38.Storage.hasVal = true;
    bVar7 = true;
    bVar3 = 1;
LAB_00193b28:
    if ((((!bVar7 && (bVar3 & 1) == 0) && (iVar1 = bcmp(this,"exynos-m2",9), iVar1 == 0)) ||
        (((!bVar7 && (bVar3 & 1) == 0 && (iVar1 = bcmp(this,"exynos-m3",9), iVar1 == 0)) ||
         ((!bVar7 && (bVar3 & 1) == 0 && (iVar1 = bcmp(this,"exynos-m4",9), iVar1 == 0)))))) ||
       ((pcVar4 == (char *)0x4 && bVar3 == 0 && (*(int *)this == 0x6f79726b)))) goto LAB_00193b9e;
  }
  else {
    if ((pcVar4 == (char *)0xa && (bool)bVar3 == false) &&
       (iVar1 = bcmp(this,"cortex-a55",10), iVar1 == 0)) {
LAB_00193b14:
      bVar12 = true;
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = 'r';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '_';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      goto LAB_00193b19;
    }
    if (((pcVar4 == (char *)0xa && (bool)bVar3 == false) &&
        (iVar1 = bcmp(this,"cortex-a57",10), iVar1 == 0)) ||
       (((pcVar4 == (char *)0xa && (bool)bVar3 == false &&
         (iVar1 = bcmp(this,"cortex-a72",10), iVar1 == 0)) ||
        ((pcVar4 == (char *)0xa && (bool)bVar3 == false &&
         (iVar1 = bcmp(this,"cortex-a73",10), iVar1 == 0)))))) goto LAB_00193ae7;
    if (pcVar4 == (char *)0xa && (bool)bVar3 == false) {
      iVar1 = bcmp(this,"cortex-a75",10);
      bVar12 = true;
      if (iVar1 == 0) goto LAB_00193b14;
      bVar7 = true;
      goto LAB_00193b28;
    }
    bVar12 = pcVar4 != (char *)0x7;
    if ((bool)bVar3 == false && !bVar12) {
      iVar1 = bcmp(this,"cyclone",7);
      bVar7 = true;
      if (iVar1 != 0) goto LAB_00193b28;
      goto LAB_00193aea;
    }
    bVar7 = pcVar4 != (char *)0x9;
    if (((bool)bVar3 != false || bVar7) || (iVar1 = bcmp(this,"exynos-m1",9), iVar1 != 0))
    goto LAB_00193b28;
LAB_00193b9e:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x772;
    local_38.Storage.hasVal = true;
    bVar3 = 1;
  }
  if ((pcVar4 == (char *)0x6 && bVar3 == 0) && (iVar1 = bcmp(this,"iwmmxt",6), iVar1 == 0)) {
    puVar2 = (uint *)&DAT_00204fd4;
LAB_00193c06:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(*puVar2 | 1);
    local_38.Storage.hasVal = true;
    bVar3 = 1;
  }
  else if ((pcVar4 == (char *)0x6 && bVar3 == 0) && (iVar1 = bcmp(this,"xscale",6), iVar1 == 0)) {
    puVar2 = (uint *)&DAT_00205054;
    goto LAB_00193c06;
  }
  if ((pcVar4 == (char *)0x5 && bVar3 == 0) && (iVar1 = bcmp(this,"swift",5), iVar1 == 0)) {
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\x04';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
  }
  else {
    if ((bVar12 || (bVar3 & 1) != 0) || (iVar1 = bcmp(this,"invalid",7), iVar1 != 0)) {
      if (bVar3 == 0) {
        return 0;
      }
      goto LAB_00193c78;
    }
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
  }
  local_38.Storage.hasVal = true;
LAB_00193c78:
  puVar2 = Optional<unsigned_int>::getPointer(&local_38);
  return *puVar2;
}

Assistant:

unsigned llvm::ARM::getDefaultExtensions(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return ARCHNames[static_cast<unsigned>(AK)].ArchBaseExtensions;

  return StringSwitch<unsigned>(CPU)
#define ARM_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
    .Case(NAME, ARCHNames[static_cast<unsigned>(ARM::ArchKind::ID)]\
            .ArchBaseExtensions | DEFAULT_EXT)
#include "llvm/Support/ARMTargetParser.def"
    .Default(ARM::AEK_INVALID);
}